

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int envy_bios_parse_power_unk78(envy_bios *bios)

{
  byte bVar1;
  uint offs;
  int iVar2;
  int iVar3;
  int iVar4;
  envy_bios_power_unk78_entry *peVar5;
  ulong uVar6;
  
  offs = (bios->power).unk78.offset;
  iVar2 = -0x16;
  if (offs != 0) {
    bios_u8(bios,offs,&(bios->power).unk78.version);
    if ((bios->power).unk78.version == '\x10') {
      iVar2 = bios_u8(bios,(bios->power).unk78.offset + 1,&(bios->power).unk78.hlen);
      iVar3 = bios_u8(bios,(bios->power).unk78.offset + 2,&(bios->power).unk78.rlen);
      iVar4 = bios_u8(bios,(bios->power).unk78.offset + 3,&(bios->power).unk78.entriesnum);
      (bios->power).unk78.valid = iVar4 == 0 && (iVar3 == 0 && iVar2 == 0);
      bVar1 = (bios->power).unk78.entriesnum;
      peVar5 = (envy_bios_power_unk78_entry *)malloc((ulong)bVar1 << 2);
      (bios->power).unk78.entries = peVar5;
      iVar2 = 0;
      for (uVar6 = 0; bVar1 != uVar6; uVar6 = uVar6 + 1) {
        peVar5[uVar6].offset =
             (uint)(bios->power).unk78.rlen * (int)uVar6 +
             (uint)(bios->power).unk78.hlen + (bios->power).unk78.offset;
      }
    }
    else {
      fprintf(_stderr,"Unknown LOW POWER PCIe table version 0x%x\n");
    }
  }
  return iVar2;
}

Assistant:

int envy_bios_parse_power_unk78(struct envy_bios *bios) {
	struct envy_bios_power_unk78 *unk78 = &bios->power.unk78;
	int i, err = 0;

	if (!unk78->offset)
		return -EINVAL;

	bios_u8(bios, unk78->offset + 0x0, &unk78->version);
	switch(unk78->version) {
	case 0x10:
		err |= bios_u8(bios, unk78->offset + 0x1, &unk78->hlen);
		err |= bios_u8(bios, unk78->offset + 0x2, &unk78->rlen);
		err |= bios_u8(bios, unk78->offset + 0x3, &unk78->entriesnum);
		unk78->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown LOW POWER PCIe table version 0x%x\n", unk78->version);
		return -EINVAL;
	};

	err = 0;
	unk78->entries = malloc(unk78->entriesnum * sizeof(struct envy_bios_power_unk78_entry));
	for (i = 0; i < unk78->entriesnum; i++) {
		uint32_t data = unk78->offset + unk78->hlen + i * unk78->rlen;

		unk78->entries[i].offset = data;
	}

	return 0;
}